

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::str_writer<char>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
           *this,align_spec *spec,str_writer<char> *f)

{
  ulong uVar1;
  size_t sVar2;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> *pbVar3;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> bVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> bVar8;
  char *pcVar9;
  long lVar10;
  
  uVar1 = f->size_;
  uVar5 = spec->width_ - uVar1;
  if (spec->width_ < uVar1 || uVar5 == 0) {
    pcVar6 = f->s;
    pcVar9 = pcVar6 + (long)(*(char **)this + (uVar1 - (long)pcVar6));
    pbVar3 = (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> *
             )(pcVar6 + (uVar1 - 1));
    if ((long)uVar1 < 1) {
      pcVar9 = *(char **)this;
      pbVar3 = this + 8;
    }
    bVar4 = *pbVar3;
LAB_001ed8ef:
    *(char **)this = pcVar9;
    this[8] = bVar4;
    return;
  }
  bVar4 = *(basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> *)
           &spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    lVar7 = *(long *)this + (uVar5 >> 1);
    bVar8 = bVar4;
    if (uVar5 < 2) {
      bVar8 = SUB41(*(undefined4 *)(this + 8),0);
    }
    *(long *)this = lVar7;
    this[8] = bVar8;
    lVar10 = f->size_ + lVar7;
    if ((long)f->size_ < 1) {
      lVar10 = lVar7;
    }
    *(ulong *)this = (uVar5 - (uVar5 >> 1)) + lVar10;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pcVar6 = (char *)(uVar5 + *(long *)this);
      *(char **)this = pcVar6;
      this[8] = bVar4;
      sVar2 = f->size_;
      pcVar9 = pcVar6 + sVar2;
      pbVar3 = (basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                *)(f->s + (sVar2 - 1));
      if ((long)sVar2 < 1) {
        pcVar9 = pcVar6;
        pbVar3 = this + 8;
      }
      bVar4 = *pbVar3;
      goto LAB_001ed8ef;
    }
    lVar7 = uVar1 + *(long *)this;
    if (uVar1 == 0) {
      lVar7 = *(long *)this;
    }
    *(ulong *)this = lVar7 + uVar5;
  }
  this[8] = bVar4;
  return;
}

Assistant:

FMT_CONSTEXPR wchar_t fill() const { return fill_; }